

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O0

void WebPRescalerExportRowExpand_C(WebPRescaler *wrk)

{
  uint8_t *puVar1;
  rescaler_t *prVar2;
  rescaler_t *prVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint8_t local_58;
  uint8_t local_54;
  int v_1;
  uint32_t J_1;
  uint64_t I;
  uint32_t A;
  uint32_t B;
  int v;
  uint32_t J;
  rescaler_t *frow;
  int x_out_max;
  rescaler_t *irow;
  uint8_t *dst;
  int x_out;
  WebPRescaler *wrk_local;
  
  puVar1 = wrk->dst;
  prVar2 = wrk->irow;
  iVar5 = wrk->dst_width * wrk->num_channels;
  prVar3 = wrk->frow;
  if (wrk->y_accum == 0) {
    for (x_out = 0; x_out < iVar5; x_out = x_out + 1) {
      lVar6 = (ulong)prVar3[x_out] * (ulong)wrk->fy_scale + 0x80000000;
      if ((int)((ulong)lVar6 >> 0x20) < 0x100) {
        local_54 = (uint8_t)((ulong)lVar6 >> 0x20);
      }
      else {
        local_54 = 0xff;
      }
      puVar1[x_out] = local_54;
    }
  }
  else {
    uVar4 = (ulong)((long)-wrk->y_accum << 0x20) / (ulong)(long)wrk->y_sub;
    for (x_out = 0; x_out < iVar5; x_out = x_out + 1) {
      lVar6 = ((ulong)(uint)-(int)uVar4 * (ulong)prVar3[x_out] +
               (uVar4 & 0xffffffff) * (ulong)prVar2[x_out] + 0x80000000 >> 0x20) *
              (ulong)wrk->fy_scale + 0x80000000;
      if ((int)((ulong)lVar6 >> 0x20) < 0x100) {
        local_58 = (uint8_t)((ulong)lVar6 >> 0x20);
      }
      else {
        local_58 = 0xff;
      }
      puVar1[x_out] = local_58;
    }
  }
  return;
}

Assistant:

void WebPRescalerExportRowExpand_C(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0);
  assert(wrk->y_expand);
  assert(wrk->y_sub != 0);
  if (wrk->y_accum == 0) {
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const uint32_t J = frow[x_out];
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  } else {
    const uint32_t B = WEBP_RESCALER_FRAC(-wrk->y_accum, wrk->y_sub);
    const uint32_t A = (uint32_t)(WEBP_RESCALER_ONE - B);
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const uint64_t I = (uint64_t)A * frow[x_out]
                       + (uint64_t)B * irow[x_out];
      const uint32_t J = (uint32_t)((I + ROUNDER) >> WEBP_RESCALER_RFIX);
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  }
}